

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDDD::VariablesQbSetSpeed(ChNodeFEAxyzDDD *this,double step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ChVector<double> local_80;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_68;
  ChVectorRef *local_50;
  undefined8 local_48;
  long local_38;
  ChVectorRef local_30;
  
  ChNodeFEAxyzDD::VariablesQbSetSpeed(&this->super_ChNodeFEAxyzDD,step);
  dVar1 = (this->DDD_dt).m_data[0];
  dVar2 = (this->DDD_dt).m_data[1];
  dVar3 = (this->DDD_dt).m_data[2];
  ChVariables::Get_qb(&local_30,*(ChVariables **)&(this->super_ChNodeFEAxyzDD).field_0x188);
  local_68._0_8_ =
       local_30.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  local_68._8_8_ = 3;
  local_48 = 0;
  local_38 = local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  local_50 = &local_30;
  if (2 < (long)local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_80,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_68,(type *)0x0);
    if (&this->DDD_dt != &local_80) {
      (this->DDD_dt).m_data[0] = local_80.m_data[0];
      (this->DDD_dt).m_data[1] = local_80.m_data[1];
      (this->DDD_dt).m_data[2] = local_80.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      dVar6 = 1.0 / step;
      dVar4 = (this->DDD_dt).m_data[2];
      dVar5 = (this->DDD_dt).m_data[1];
      (this->DDD_dtdt).m_data[0] = dVar6 * ((this->DDD_dt).m_data[0] - dVar1);
      (this->DDD_dtdt).m_data[1] = dVar6 * (dVar5 - dVar2);
      (this->DDD_dtdt).m_data[2] = dVar6 * (dVar4 - dVar3);
    }
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::VariablesQbSetSpeed(double step) {
    ChNodeFEAxyzDD::VariablesQbSetSpeed(step);

    ChVector<> oldDDD_dt = DDD_dt;
    SetDDD_dt(variables_DDD->Get_qb().segment(0, 3));
    if (step) {
        SetDDD_dtdt((DDD_dt - oldDDD_dt) / step);
    }
}